

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cpp
# Opt level: O0

void __thiscall icu_63::StringPiece::StringPiece(StringPiece *this,char *str)

{
  size_t sVar1;
  int32_t local_24;
  char *str_local;
  StringPiece *this_local;
  
  this->ptr_ = str;
  if (str == (char *)0x0) {
    local_24 = 0;
  }
  else {
    sVar1 = strlen(str);
    local_24 = (int32_t)sVar1;
  }
  this->length_ = local_24;
  return;
}

Assistant:

StringPiece::StringPiece(const StringPiece& x, int32_t pos) {
  if (pos < 0) {
    pos = 0;
  } else if (pos > x.length_) {
    pos = x.length_;
  }
  ptr_ = x.ptr_ + pos;
  length_ = x.length_ - pos;
}